

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEnginePrivate::systemStateChanged(QRasterPaintEnginePrivate *this)

{
  Representation RVar1;
  bool bVar2;
  int *piVar3;
  QRasterPaintEngineState *pQVar4;
  QRasterPaintEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  QRasterPaintEngine *q;
  QRegion clippedDeviceRgn;
  int in_stack_ffffffffffffffa8;
  int awidth;
  QClipData *in_stack_ffffffffffffffb8;
  QRasterPaintEnginePrivate *this_00;
  undefined8 local_38;
  undefined8 local_30;
  int local_20;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_1c = QPaintDevice::width((QPaintDevice *)0x563b31);
  piVar3 = qMin<int>(&QT_RASTER_COORD_LIMIT,&local_1c);
  awidth = *piVar3;
  local_20 = QPaintDevice::height((QPaintDevice *)0x563b60);
  qMin<int>(&QT_RASTER_COORD_LIMIT,&local_20);
  QRect::QRect((QRect *)in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,awidth,
               in_stack_ffffffffffffffa8);
  (in_RDI->deviceRectUnclipped).x1 = (Representation)(undefined4)local_18;
  (in_RDI->deviceRectUnclipped).y1 = (Representation)local_18._4_4_;
  (in_RDI->deviceRectUnclipped).x2 = (Representation)(undefined4)local_10;
  (in_RDI->deviceRectUnclipped).y2 = (Representation)local_10._4_4_;
  bVar2 = QRegion::isEmpty(&(in_RDI->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.
                            systemClip);
  if (bVar2) {
    RVar1.m_i = (in_RDI->deviceRectUnclipped).y1.m_i;
    (in_RDI->deviceRect).x1 = (Representation)(in_RDI->deviceRectUnclipped).x1.m_i;
    (in_RDI->deviceRect).y1 = (Representation)RVar1.m_i;
    RVar1.m_i = (in_RDI->deviceRectUnclipped).y2.m_i;
    (in_RDI->deviceRect).x2 = (Representation)(in_RDI->deviceRectUnclipped).x2.m_i;
    (in_RDI->deviceRect).y2 = (Representation)RVar1.m_i;
    QScopedPointer<QClipData,_QScopedPointerDeleter<QClipData>_>::operator->(&in_RDI->baseClip);
    QClipData::setClipRect((QClipData *)this_00,(QRect *)in_stack_ffffffffffffffb8);
  }
  else {
    QRegion::operator&((QRegion *)in_stack_ffffffffffffffb8,(QRect *)in_RDI);
    QVar5 = QRegion::boundingRect((QRegion *)in_stack_ffffffffffffffb8);
    local_38 = QVar5._0_8_;
    (in_RDI->deviceRect).x1 = (Representation)(undefined4)local_38;
    (in_RDI->deviceRect).y1 = (Representation)local_38._4_4_;
    local_30 = QVar5._8_8_;
    (in_RDI->deviceRect).x2 = (Representation)(undefined4)local_30;
    (in_RDI->deviceRect).y2 = (Representation)local_30._4_4_;
    QScopedPointer<QClipData,_QScopedPointerDeleter<QClipData>_>::operator->(&in_RDI->baseClip);
    QClipData::setClipRegion(in_stack_ffffffffffffffb8,(QRegion *)in_RDI);
    QRegion::~QRegion((QRegion *)in_RDI);
  }
  RVar1.m_i = (in_RDI->deviceRect).y1.m_i;
  (in_RDI->super_QPaintEngineExPrivate).exDeviceRect.x1 =
       (Representation)(in_RDI->deviceRect).x1.m_i;
  (in_RDI->super_QPaintEngineExPrivate).exDeviceRect.y1 = (Representation)RVar1.m_i;
  RVar1.m_i = (in_RDI->deviceRect).y2.m_i;
  (in_RDI->super_QPaintEngineExPrivate).exDeviceRect.x2 =
       (Representation)(in_RDI->deviceRect).x2.m_i;
  (in_RDI->super_QPaintEngineExPrivate).exDeviceRect.y2 = (Representation)RVar1.m_i;
  q_func(in_RDI);
  pQVar4 = QRasterPaintEngine::state((QRasterPaintEngine *)0x563ca9);
  if (pQVar4 != (QRasterPaintEngineState *)0x0) {
    pQVar4 = QRasterPaintEngine::state((QRasterPaintEngine *)0x563cb9);
    pQVar4->strokeFlags = pQVar4->strokeFlags | 0x80;
    pQVar4 = QRasterPaintEngine::state((QRasterPaintEngine *)0x563cd5);
    pQVar4->fillFlags = pQVar4->fillFlags | 0x80;
    pQVar4 = QRasterPaintEngine::state((QRasterPaintEngine *)0x563cf1);
    pQVar4->pixmapFlags = pQVar4->pixmapFlags | 0x80;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEnginePrivate::systemStateChanged()
{
    deviceRectUnclipped = QRect(0, 0,
            qMin(QT_RASTER_COORD_LIMIT, device->width()),
            qMin(QT_RASTER_COORD_LIMIT, device->height()));

    if (!systemClip.isEmpty()) {
        QRegion clippedDeviceRgn = systemClip & deviceRectUnclipped;
        deviceRect = clippedDeviceRgn.boundingRect();
        baseClip->setClipRegion(clippedDeviceRgn);
    } else {
        deviceRect = deviceRectUnclipped;
        baseClip->setClipRect(deviceRect);
    }
#ifdef QT_DEBUG_DRAW
    qDebug() << "systemStateChanged" << this << "deviceRect" << deviceRect << deviceRectUnclipped << systemClip;
#endif

    exDeviceRect = deviceRect;

    Q_Q(QRasterPaintEngine);
    if (q->state()) {
        q->state()->strokeFlags |= QPaintEngine::DirtyClipRegion;
        q->state()->fillFlags |= QPaintEngine::DirtyClipRegion;
        q->state()->pixmapFlags |= QPaintEngine::DirtyClipRegion;
    }
}